

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_mem clCreatePipe(cl_context context,cl_mem_flags flags,cl_uint pipe_packet_size,
                   cl_uint pipe_max_packets,cl_pipe_properties *properties,cl_int *errcode_ret)

{
  CTracker *pCVar1;
  CLIntercept *this;
  byte bVar2;
  cl_mem p_Var3;
  time_point end;
  allocator local_71;
  time_point local_70;
  cl_int localErrorCode;
  uint64_t local_60;
  string local_58;
  cl_mem_flags local_38;
  
  this = g_pIntercept;
  if ((g_pIntercept == (CLIntercept *)0x0) ||
     ((g_pIntercept->m_Dispatch).clCreatePipe == (cl_api_clCreatePipe)0x0)) {
    if (errcode_ret != (cl_int *)0x0) {
      *errcode_ret = -0x22;
    }
    return (cl_mem)0x0;
  }
  local_60 = (g_pIntercept->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  bVar2 = (g_pIntercept->m_Config).CallLogging;
  if ((bool)bVar2 == true) {
    local_70.__d.__r = (duration)(duration)properties;
    CEnumNameMap::name_mem_flags_abi_cxx11_(&local_58,&g_pIntercept->m_EnumNameMap,flags);
    CLIntercept::callLoggingEnter
              (this,"clCreatePipe",local_60,(cl_kernel)0x0,
               "context = %p, flags = %s (%llX), pipe_packet_size = %u, pipe_max_packets = %u",
               context,local_58._M_dataplus._M_p,flags,(ulong)pipe_packet_size,
               (ulong)pipe_max_packets);
    std::__cxx11::string::~string((string *)&local_58);
    bVar2 = (this->m_Config).CallLogging;
    properties = (cl_pipe_properties *)local_70;
  }
  localErrorCode = 0;
  if ((((bVar2 & 1) == 0) && ((this->m_Config).ErrorLogging == false)) &&
     ((this->m_Config).ErrorAssert == false)) {
    if ((errcode_ret == (cl_int *)0x0) && ((this->m_Config).NoErrors != false)) {
LAB_0012ba62:
      errcode_ret = &localErrorCode;
    }
  }
  else if (errcode_ret == (cl_int *)0x0) goto LAB_0012ba62;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_70.__d.__r = (duration)0;
  }
  else {
    local_38 = flags;
    local_70.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    flags = local_38;
  }
  p_Var3 = (*(this->m_Dispatch).clCreatePipe)
                     (context,flags,pipe_packet_size,pipe_max_packets,properties,errcode_ret);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_60 &&
        (local_60 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_58,"",&local_71);
      CLIntercept::updateHostTimingStats(this,"clCreatePipe",&local_58,local_70,end);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar2 = (this->m_Config).ErrorAssert;
    if ((((bool)bVar2 == false) && ((this->m_Config).NoErrors != true)) || (*errcode_ret == 0))
    goto LAB_0012bbba;
  }
  else {
    if (*errcode_ret == 0) goto LAB_0012bbba;
    CLIntercept::logError(this,"clCreatePipe",*errcode_ret);
    bVar2 = (this->m_Config).ErrorAssert;
  }
  if ((bVar2 & 1) != 0) {
    raise(5);
  }
  if ((this->m_Config).NoErrors == true) {
    *errcode_ret = 0;
  }
LAB_0012bbba:
  if ((p_Var3 != (cl_mem)0x0) && ((this->m_Config).LeakChecking != false)) {
    LOCK();
    pCVar1 = &(this->m_ObjectTracker).m_MemObjects;
    (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clCreatePipe",*errcode_ret,(cl_event *)0x0,(cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_58,"",&local_71);
    CLIntercept::chromeCallLoggingExit(this,"clCreatePipe",&local_58,false,0,local_70,end);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return p_Var3;
}

Assistant:

CL_API_ENTRY cl_mem CL_API_CALL CLIRN(clCreatePipe) (
    cl_context context,
    cl_mem_flags flags,
    cl_uint pipe_packet_size,
    cl_uint pipe_max_packets,
    const cl_pipe_properties* properties,
    cl_int* errcode_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clCreatePipe )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER( "context = %p, flags = %s (%llX), pipe_packet_size = %u, pipe_max_packets = %u",
            context,
            pIntercept->enumName().name_mem_flags( flags ).c_str(),
            flags,
            pipe_packet_size,
            pipe_max_packets );
        CHECK_ERROR_INIT( errcode_ret );
        HOST_PERFORMANCE_TIMING_START();

        cl_mem  retVal = pIntercept->dispatch().clCreatePipe(
            context,
            flags,
            pipe_packet_size,
            pipe_max_packets,
            properties,
            errcode_ret );

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( errcode_ret[0] );
        ADD_OBJECT_ALLOCATION( retVal );
        CALL_LOGGING_EXIT( errcode_ret[0] );

        return retVal;
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}